

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiRecorder.cpp
# Opt level: O2

bool __thiscall MidiRecorder::writeFile(MidiRecorder *this,QFile *file,char *data,qint64 len)

{
  long lVar1;
  QDebug local_40;
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  char *local_20;
  
  lVar1 = QIODevice::write((char *)file,(longlong)data);
  if (lVar1 != len) {
    local_38 = 2;
    local_24 = 0;
    local_34 = 0;
    uStack_2c = 0;
    local_20 = "default";
    QMessageLogger::debug();
    QDebug::operator<<(&local_40,"MidiRecorder: Error writing file");
    QDebug::~QDebug(&local_40);
  }
  return lVar1 == len;
}

Assistant:

bool MidiRecorder::writeFile(QFile &file, const char *data, qint64 len) {
	qint64 writtenLen = file.write(data, len);
	if (writtenLen == len) return true;
	qDebug() << "MidiRecorder: Error writing file";
	return false;
}